

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thybrd1_.c
# Opt level: O0

void fcn(int *n,double *x,double *fvec,int *iflag)

{
  double temp2;
  double temp1;
  double temp;
  int k;
  int *iflag_local;
  double *fvec_local;
  double *x_local;
  int *n_local;
  
  if (*iflag != 0) {
    for (k = 1; k <= *n; k = k + 1) {
      temp1 = 0.0;
      if (k != 1) {
        temp1 = x[k + -2];
      }
      temp2 = 0.0;
      if (k != *n) {
        temp2 = x[k];
      }
      fvec[k + -1] = (((3.0 - (x[k + -1] + x[k + -1])) * x[k + -1] - temp1) - (temp2 + temp2)) + 1.0
      ;
    }
  }
  return;
}

Assistant:

void fcn(const int *n, const real *x, real *fvec, int *iflag)
{
/*      subroutine fcn for hybrd1 example. */

  int k;
  real temp, temp1, temp2;
  assert(*n == 9);

  if (*iflag == 0) {
    /*      insert print statements here when nprint is positive. */
    /* if the nprint parameter to lmder is positive, the function is
       called every nprint iterations with iflag=0, so that the
       function may perform special operations, such as printing
       residuals. */
    return;
  }

  /* compute residuals */
  for (k=1; k <= *n; k++) {
    temp = (3 - 2*x[k-1])*x[k-1];
    temp1 = 0;
    if (k != 1) {
      temp1 = x[k-1-1];
    }
    temp2 = 0;
    if (k != *n) {
      temp2 = x[k+1-1];
    }
    fvec[k-1] = temp - temp1 - 2*temp2 + 1;
  }
  return;
}